

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flattening.cpp
# Opt level: O1

FormulaList * Shell::Flattening::flatten(FormulaList *fs,Connective con)

{
  List<Kernel::Formula_*> *pLVar1;
  bool bVar2;
  Formula *pFVar3;
  ulong uVar4;
  FormulaList *pFVar5;
  Formula **ppFVar6;
  bool bVar7;
  Stack<Kernel::Formula_*> res;
  Stack<Lib::List<Kernel::Formula_*>_*> toDo;
  Stack<Kernel::Formula_*> local_70;
  Stack<Lib::List<Kernel::Formula_*>_*> local_50;
  
  if (fs == (FormulaList *)0x0) {
    fs = (FormulaList *)0x0;
  }
  else {
    local_70._capacity = 8;
    local_70._stack =
         (Formula **)
         ::Lib::FixedSizeAllocator<64UL>::alloc
                   ((FixedSizeAllocator<64UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    local_70._end = local_70._stack + local_70._capacity;
    local_50._capacity = 8;
    local_70._cursor = local_70._stack;
    local_50._stack =
         (List<Kernel::Formula_*> **)
         ::Lib::FixedSizeAllocator<64UL>::alloc
                   ((FixedSizeAllocator<64UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    local_50._end = local_50._stack + local_50._capacity;
    bVar7 = false;
    pFVar5 = fs;
    local_50._cursor = local_50._stack;
    do {
      while (pFVar5->_head->_connective == con) {
        pLVar1 = pFVar5->_tail;
        if (pLVar1 != (List<Kernel::Formula_*> *)0x0) {
          if (local_50._cursor == local_50._end) {
            ::Lib::Stack<Lib::List<Kernel::Formula_*>_*>::expand(&local_50);
          }
          *local_50._cursor = pLVar1;
          local_50._cursor = local_50._cursor + 1;
        }
        pFVar5 = *(FormulaList **)(pFVar5->_head + 1);
        bVar7 = true;
      }
      pFVar3 = flatten(pFVar5->_head);
      if (pFVar3 != pFVar5->_head) {
        bVar7 = true;
      }
      if (local_70._cursor == local_70._end) {
        ::Lib::Stack<Kernel::Formula_*>::expand(&local_70);
      }
      *local_70._cursor = pFVar3;
      ppFVar6 = local_70._cursor + 1;
      pFVar5 = pFVar5->_tail;
      bVar2 = true;
      if (pFVar5 == (List<Kernel::Formula_*> *)0x0) {
        if (local_50._cursor == local_50._stack) {
          pFVar5 = (List<Kernel::Formula_*> *)0x0;
          bVar2 = false;
        }
        else {
          pFVar5 = local_50._cursor[-1];
          local_50._cursor = local_50._cursor + -1;
        }
      }
      local_70._cursor = ppFVar6;
    } while (bVar2);
    if (bVar7) {
      if (local_70._stack == ppFVar6) {
        fs = (FormulaList *)0x0;
      }
      else {
        pFVar5 = (FormulaList *)0x0;
        do {
          pFVar3 = ppFVar6[-1];
          fs = (FormulaList *)
               ::Lib::FixedSizeAllocator<16UL>::alloc
                         ((FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18))
          ;
          ppFVar6 = ppFVar6 + -1;
          fs->_head = pFVar3;
          fs->_tail = pFVar5;
          pFVar5 = fs;
        } while (ppFVar6 != local_70._stack);
      }
    }
    if (local_50._stack != (List<Kernel::Formula_*> **)0x0) {
      uVar4 = local_50._capacity * 8 + 0xf & 0xfffffffffffffff0;
      if (uVar4 == 0) {
        *local_50._stack = (List<Kernel::Formula_*> *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_50._stack;
      }
      else if (uVar4 < 0x11) {
        *local_50._stack = (List<Kernel::Formula_*> *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_50._stack;
      }
      else if (uVar4 < 0x19) {
        *local_50._stack = (List<Kernel::Formula_*> *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_50._stack;
      }
      else if (uVar4 < 0x21) {
        *local_50._stack = (List<Kernel::Formula_*> *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_50._stack;
      }
      else if (uVar4 < 0x31) {
        *local_50._stack = (List<Kernel::Formula_*> *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_50._stack;
      }
      else if (uVar4 < 0x41) {
        *local_50._stack = (List<Kernel::Formula_*> *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_50._stack;
      }
      else {
        operator_delete(local_50._stack,0x10);
      }
    }
    if (local_70._stack != (Formula **)0x0) {
      uVar4 = local_70._capacity * 8 + 0xf & 0xfffffffffffffff0;
      if (uVar4 == 0) {
        *local_70._stack = (Formula *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_70._stack;
      }
      else if (uVar4 < 0x11) {
        *local_70._stack = (Formula *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_70._stack;
      }
      else if (uVar4 < 0x19) {
        *local_70._stack = (Formula *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_70._stack;
      }
      else if (uVar4 < 0x21) {
        *local_70._stack = (Formula *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_70._stack;
      }
      else if (uVar4 < 0x31) {
        *local_70._stack = (Formula *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_70._stack;
      }
      else if (uVar4 < 0x41) {
        *local_70._stack = (Formula *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_70._stack;
      }
      else {
        operator_delete(local_70._stack,0x10);
      }
    }
  }
  return fs;
}

Assistant:

FormulaList* Flattening::flatten (FormulaList* fs, 
				  Connective con)
{
  ASS(con == OR || con == AND);

#if 1
  if(!fs) {
    return 0;
  }

  FormulaList* fs0 = fs;

  bool modified = false;
  Stack<Formula*> res(8);
  Stack<FormulaList*> toDo(8);
  for(;;) {
    if(fs->head()->connective()==con) {
      modified = true;
      if(fs->tail()) {
	toDo.push(fs->tail());
      }
      fs = fs->head()->args();
      continue;
    }
    Formula* hdRes = flatten(fs->head());
    if(hdRes!=fs->head()) {
      modified = true;
    }
    res.push(hdRes);
    fs = fs->tail();
    if(!fs) {
      if(toDo.isEmpty()) {
	break;
      }
      fs = toDo.pop();
    }
  }
  if(!modified) {
    return fs0;
  }
  FormulaList* resLst = 0;
  FormulaList::pushFromIterator(Stack<Formula*>::TopFirstIterator(res), resLst);
  return resLst;
#else
  if (fs->isEmpty()) {
    return fs;
  }
  Formula* head = flatten(fs->head());
  FormulaList* tail = flatten(fs->tail(),con);

  if (head->connective() == con) {
    return FormulaList::append(head->args(), tail);
  }

  if (head == fs->head() && tail == fs->tail()) {
    return fs;
  }
  return new FormulaList(head,tail);
#endif
}